

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall
google::protobuf::EnumValueDescriptorProto::MergePartialFromCodedStream
          (EnumValueDescriptorProto *this,CodedInputStream *input)

{
  uint8 *puVar1;
  bool bVar2;
  uint uVar3;
  string *value;
  EnumValueOptions *value_00;
  uint uVar4;
  uint32 tag;
  uint32 temp;
  uint32 local_2c;
  
LAB_001f4841:
  do {
    while( true ) {
      puVar1 = input->buffer_;
      if ((puVar1 < input->buffer_end_) && (tag = (uint32)(char)*puVar1, -1 < (char)*puVar1)) {
        input->last_tag_ = tag;
        input->buffer_ = puVar1 + 1;
      }
      else {
        tag = io::CodedInputStream::ReadTagFallback(input);
        input->last_tag_ = tag;
      }
      if (tag == 0) {
        return true;
      }
      uVar4 = tag >> 3;
      uVar3 = tag & 7;
      if (uVar4 != 3) break;
      if (uVar3 != 2) goto LAB_001f4931;
LAB_001f494b:
      value_00 = mutable_options(this);
      bVar2 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::EnumValueOptions>
                        (input,value_00);
      if (!bVar2) {
        return false;
      }
      bVar2 = io::CodedInputStream::ExpectAtEnd(input);
      if (bVar2) {
        return true;
      }
    }
    if (uVar4 == 2) {
      if (uVar3 == 0) goto LAB_001f48f0;
    }
    else if ((uVar4 == 1) && (uVar3 == 2)) {
      value = mutable_name_abi_cxx11_(this);
      bVar2 = internal::WireFormatLite::ReadString(input,value);
      if (!bVar2) {
        return false;
      }
      internal::WireFormat::VerifyUTF8StringFallback
                ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,PARSE);
      puVar1 = input->buffer_;
      if ((puVar1 < input->buffer_end_) && (*puVar1 == '\x10')) {
        input->buffer_ = puVar1 + 1;
LAB_001f48f0:
        bVar2 = io::CodedInputStream::ReadVarint32(input,&local_2c);
        if (!bVar2) {
          return false;
        }
        this->number_ = local_2c;
        *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
        puVar1 = input->buffer_;
        if ((puVar1 < input->buffer_end_) && (*puVar1 == '\x1a')) {
          input->buffer_ = puVar1 + 1;
          goto LAB_001f494b;
        }
      }
      goto LAB_001f4841;
    }
LAB_001f4931:
    if (uVar3 == 4) {
      return true;
    }
    bVar2 = internal::WireFormat::SkipField(input,tag,&this->_unknown_fields_);
    if (!bVar2) {
      return false;
    }
  } while( true );
}

Assistant:

bool EnumValueDescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(16)) goto parse_number;
        break;
      }

      // optional int32 number = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_number:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &number_)));
          set_has_number();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(26)) goto parse_options;
        break;
      }

      // optional .google.protobuf.EnumValueOptions options = 3;
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_options:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}